

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O3

void sortOpts(StringMap<llvm::cl::Option_*,_llvm::MallocAllocator> *OptMap,
             SmallVectorImpl<std::pair<const_char_*,_llvm::cl::Option_*>_> *Opts,bool ShowHidden)

{
  StringMapEntryBase ***pppSVar1;
  ushort uVar2;
  long lVar3;
  byte in_CL;
  undefined7 in_register_00000011;
  SmallVectorTemplateBase<std::pair<const_char_*,_llvm::cl::Option_*>,_true> *this;
  ulong __nmemb;
  uint *puVar4;
  SmallPtrSet<llvm::cl::Option_*,_32U> OptionSet;
  pair<llvm::SmallPtrSetIterator<llvm::cl::Option_*>,_bool> local_168;
  SmallPtrSetImpl<llvm::cl::Option_*> local_150;
  void *local_130 [32];
  
  this = (SmallVectorTemplateBase<std::pair<const_char_*,_llvm::cl::Option_*>,_true> *)
         CONCAT71(in_register_00000011,ShowHidden);
  local_150.super_SmallPtrSetImplBase.SmallArray = local_130;
  local_150.super_SmallPtrSetImplBase.CurArraySize = 0x20;
  local_150.super_SmallPtrSetImplBase.NumNonEmpty = 0;
  local_150.super_SmallPtrSetImplBase.NumTombstones = 0;
  puVar4 = (uint *)OptMap;
  if ((int)Opts != 0) {
    for (; (*(long *)puVar4 == 0 || (*(long *)puVar4 == -8)); puVar4 = puVar4 + 2) {
    }
  }
  pppSVar1 = &(OptMap->super_StringMapImpl).TheTable + ((ulong)Opts & 0xffffffff);
  local_150.super_SmallPtrSetImplBase.CurArray = local_150.super_SmallPtrSetImplBase.SmallArray;
  if ((StringMapEntryBase ***)puVar4 != pppSVar1) {
    lVar3 = *(long *)puVar4;
    do {
      uVar2 = *(ushort *)&(*(Option **)(lVar3 + 8))->field_0xc >> 5 & 3;
      if (((uVar2 == 1 & (in_CL ^ 1)) == 0 && uVar2 != 2) &&
         (llvm::SmallPtrSetImpl<llvm::cl::Option_*>::insert
                    (&local_168,&local_150,*(Option **)(lVar3 + 8)), local_168.second == true)) {
        local_168.first.super_SmallPtrSetIteratorImpl.Bucket = (void **)(*(long *)puVar4 + 0x10);
        local_168.first.super_SmallPtrSetIteratorImpl.End = *(void ***)(*(long *)puVar4 + 8);
        llvm::SmallVectorTemplateBase<std::pair<const_char_*,_llvm::cl::Option_*>,_true>::push_back
                  (this,(pair<const_char_*,_llvm::cl::Option_*> *)&local_168);
      }
      do {
        do {
          puVar4 = puVar4 + 2;
          lVar3 = *(long *)puVar4;
        } while (lVar3 == 0);
      } while (lVar3 == -8);
    } while ((StringMapEntryBase ***)puVar4 != pppSVar1);
  }
  __nmemb = (ulong)(this->
                   super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::Option_*>,_void>
                   ).super_SmallVectorBase.Size;
  if (1 < __nmemb) {
    qsort((this->super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::Option_*>,_void>)
          .super_SmallVectorBase.BeginX,__nmemb,0x10,OptNameCompare);
  }
  if (local_150.super_SmallPtrSetImplBase.CurArray != local_150.super_SmallPtrSetImplBase.SmallArray
     ) {
    free(local_150.super_SmallPtrSetImplBase.CurArray);
  }
  return;
}

Assistant:

static void sortOpts(StringMap<Option *> &OptMap,
                     SmallVectorImpl<std::pair<const char *, Option *>> &Opts,
                     bool ShowHidden) {
  SmallPtrSet<Option *, 32> OptionSet; // Duplicate option detection.

  for (StringMap<Option *>::iterator I = OptMap.begin(), E = OptMap.end();
       I != E; ++I) {
    // Ignore really-hidden options.
    if (I->second->getOptionHiddenFlag() == ReallyHidden)
      continue;

    // Unless showhidden is set, ignore hidden flags.
    if (I->second->getOptionHiddenFlag() == Hidden && !ShowHidden)
      continue;

    // If we've already seen this option, don't add it to the list again.
    if (!OptionSet.insert(I->second).second)
      continue;

    Opts.push_back(
        std::pair<const char *, Option *>(I->getKey().data(), I->second));
  }

  // Sort the options list alphabetically.
  array_pod_sort(Opts.begin(), Opts.end(), OptNameCompare);
}